

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

Level * __thiscall hta::Metric::get_level(Metric *this,Duration interval)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>,_bool>
  pVar3;
  _Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>
  local_a0 [2];
  _Base_ptr local_90;
  undefined1 local_88;
  Metric *local_80;
  Level local_78;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>,_bool>
  local_40;
  iterator iStack_28;
  bool added;
  _Self local_20;
  iterator it;
  Metric *this_local;
  Duration interval_local;
  
  it._M_node = (_Base_ptr)this;
  this_local = (Metric *)interval.__r;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>_>
       ::find(&this->levels_,(key_type *)&this_local);
  iStack_28 = std::
              map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>_>
              ::end(&this->levels_);
  bVar1 = std::operator==(&local_20,&stack0xffffffffffffffd8);
  if (bVar1) {
    local_80 = this_local;
    restore_level(&local_78,this,(Duration)this_local);
    pVar3 = std::
            map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>_>
            ::try_emplace<hta::Level>(&this->levels_,(key_type *)&this_local,&local_78);
    local_90 = (_Base_ptr)pVar3.first._M_node;
    local_88 = pVar3.second;
    local_40.first._M_node = local_90;
    local_40.second = (bool)local_88;
    std::
    tie<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::Level>>,bool>
              (local_a0,(bool *)&local_20);
    std::
    tuple<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::Level>>&,bool&>
    ::operator=((tuple<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::Level>>&,bool&>
                 *)local_a0,&local_40);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>
           ::operator->(&local_20);
  return &ppVar2->second;
}

Assistant:

Level& Metric::get_level(Duration interval)
{
    auto it = levels_.find(interval);
    if (it == levels_.end())
    {
        bool added;
        std::tie(it, added) = levels_.try_emplace(interval, restore_level(interval));
    }
    return it->second;
}